

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_wbuf.c
# Opt level: O0

void lj_wbuf_flush(lj_wbuf *buf)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  int *piVar4;
  lj_wbuf *in_RDI;
  size_t written;
  size_t len;
  
  uVar2 = (long)in_RDI->pos - (long)in_RDI->buf;
  iVar1 = lj_wbuf_test_flag(in_RDI,'\x02');
  if (iVar1 == 0) {
    sVar3 = (*in_RDI->writer)(&in_RDI->buf,uVar2,in_RDI->ctx);
    if (sVar3 < uVar2) {
      in_RDI->flags = in_RDI->flags | 1;
      piVar4 = __errno_location();
      in_RDI->saved_errno = *piVar4;
    }
    if (in_RDI->buf == (uint8_t *)0x0) {
      in_RDI->flags = in_RDI->flags | 2;
      piVar4 = __errno_location();
      in_RDI->saved_errno = *piVar4;
    }
    in_RDI->pos = in_RDI->buf;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_wbuf_flush(struct lj_wbuf *buf)
{
  const size_t len = wbuf_len(buf);
  size_t written;

  if (LJ_UNLIKELY(lj_wbuf_test_flag(buf, STREAM_STOP)))
    return;

  written = buf->writer((const void **)&buf->buf, len, buf->ctx);

  if (LJ_UNLIKELY(written < len)) {
    wbuf_set_flag(buf, STREAM_ERRIO);
    wbuf_save_errno(buf);
  }
  if (LJ_UNLIKELY(buf->buf == NULL)) {
    wbuf_set_flag(buf, STREAM_STOP);
    wbuf_save_errno(buf);
  }
  buf->pos = buf->buf;
}